

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidReorganizeDataBlockSize(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  int iVar3;
  ConvolutionLayerParams *pCVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  ReorganizeDataLayerParams *pRVar10;
  ostream *poVar11;
  int iVar12;
  Result res;
  Model m;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_48.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_70 + 0x10;
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  iVar3 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  iVar12 = iVar3 + 1;
  (pAVar9->shape_).current_size_ = iVar12;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 1;
  iVar3 = (pAVar9->shape_).total_size_;
  if (iVar12 == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  iVar12 = iVar3 + 1;
  (pAVar9->shape_).current_size_ = iVar12;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 0x12;
  iVar3 = (pAVar9->shape_).total_size_;
  if (iVar12 == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  iVar12 = iVar3 + 1;
  (pAVar9->shape_).current_size_ = iVar12;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 5;
  iVar3 = (pAVar9->shape_).total_size_;
  if (iVar12 == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar3 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 7;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_48.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  iVar3 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  iVar12 = iVar3 + 1;
  (pAVar9->shape_).current_size_ = iVar12;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 1;
  iVar3 = (pAVar9->shape_).total_size_;
  if (iVar12 == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  iVar12 = iVar3 + 1;
  (pAVar9->shape_).current_size_ = iVar12;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 2;
  iVar3 = (pAVar9->shape_).total_size_;
  if (iVar12 == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  iVar12 = iVar3 + 1;
  (pAVar9->shape_).current_size_ = iVar12;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 0xf;
  iVar3 = (pAVar9->shape_).total_size_;
  if (iVar12 == iVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar3 + 1);
  }
  iVar3 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar3 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar3] = 0x15;
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_48.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x159) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x159;
    pRVar10 = (ReorganizeDataLayerParams *)operator_new(0x20);
    CoreML::Specification::ReorganizeDataLayerParams::ReorganizeDataLayerParams(pRVar10);
    (this_00->layer_).reorganizedata_ = pRVar10;
  }
  *(undefined4 *)&(((this_00->layer_).convolution_)->kernelsize_).rep_ = 1;
  if (this_00->_oneof_case_[0] != 0x159) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x159;
    pRVar10 = (ReorganizeDataLayerParams *)operator_new(0x20);
    CoreML::Specification::ReorganizeDataLayerParams::ReorganizeDataLayerParams(pRVar10);
    (this_00->layer_).reorganizedata_ = pRVar10;
  }
  pCVar4 = (this_00->layer_).convolution_;
  (pCVar4->kernelsize_).current_size_ = 1;
  (pCVar4->kernelsize_).total_size_ = 0;
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_48);
  bVar5 = CoreML::Result::good((Result *)local_70);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17c2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return (uint)bVar5;
}

Assistant:

int testInvalidReorganizeDataBlockSize() {
    // Tests that the validator rejects layers with an impossible block size.
    // (Block size for a reorganizeData layer must be greater than 1).
    Specification::Model m;
    Specification::FeatureDescription* input = m.mutable_description()->add_input();
    input->set_name("input");
    Specification::ArrayFeatureType* shape = input->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(18);
    shape->add_shape(5);
    shape->add_shape(7);

    Specification::FeatureDescription* output = m.mutable_description()->add_output();
    output->set_name("output");
    output->mutable_type()->mutable_multiarraytype();
    Specification::ArrayFeatureType* outShape = output->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(1);
    outShape->add_shape(2);
    outShape->add_shape(15);
    outShape->add_shape(21);

    Specification::NeuralNetwork* nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer* layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("output");
    layer->mutable_reorganizedata()->set_mode(Specification::ReorganizeDataLayerParams::DEPTH_TO_SPACE);
    layer->mutable_reorganizedata()->set_blocksize(1);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);

    return 0;
}